

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall cmGhsMultiTargetGenerator::Generate(cmGhsMultiTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string msg;
  string local_f0;
  undefined1 local_d0 [64];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  TVar2 = cmGeneratorTarget::GetType(this->GeneratorTarget);
  switch(TVar2) {
  case EXECUTABLE:
    cmGeneratorTarget::GetExecutableNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName)
    ;
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d0._32_8_ != local_d0 + 0x30) {
      operator_delete((void *)local_d0._32_8_,local_d0._48_8_ + 1);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    bVar1 = DetermineIfIntegrityApp(this);
    if (bVar1) {
      this->TagType = INTERGRITY_APPLICATION;
    }
    else {
      this->TagType = PROGRAM;
    }
    break;
  case STATIC_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d0._32_8_ != local_d0 + 0x30) {
      operator_delete((void *)local_d0._32_8_,local_d0._48_8_ + 1);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    this->TagType = LIBRARY;
    break;
  case SHARED_LIBRARY:
    local_d0._24_8_ = (this->Name)._M_dataplus._M_p;
    local_d0._16_8_ = (this->Name)._M_string_length;
    local_d0._0_8_ = &DAT_0000002e;
    local_d0._8_8_ = "add_library(<name> SHARED ...) not supported: ";
    views._M_len = 2;
    views._M_array = (iterator)local_d0;
    cmCatViews_abi_cxx11_(&local_f0,views);
    cmSystemTools::Message(&local_f0,(char *)0x0);
    goto LAB_003abf03;
  case MODULE_LIBRARY:
    local_d0._24_8_ = (this->Name)._M_dataplus._M_p;
    local_d0._16_8_ = (this->Name)._M_string_length;
    local_d0._0_8_ = &DAT_0000002e;
    local_d0._8_8_ = "add_library(<name> MODULE ...) not supported: ";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_d0;
    cmCatViews_abi_cxx11_(&local_f0,views_00);
    cmSystemTools::Message(&local_f0,(char *)0x0);
LAB_003abf03:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return;
    }
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    return;
  case OBJECT_LIBRARY:
    cmGeneratorTarget::GetLibraryNames((Names *)local_d0,this->GeneratorTarget,&this->ConfigName);
    std::__cxx11::string::operator=((string *)&this->TargetNameReal,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_d0._32_8_ != local_d0 + 0x30) {
      operator_delete((void *)local_d0._32_8_,local_d0._48_8_ + 1);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    this->TagType = SUBPROJECT;
    break;
  case UTILITY:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    goto LAB_003ac068;
  case GLOBAL_TARGET:
    cmGeneratorTarget::GetName_abi_cxx11_(this->GeneratorTarget);
    std::__cxx11::string::_M_assign((string *)&this->TargetNameReal);
    (*((this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator
      [0x1a])();
    iVar3 = std::__cxx11::string::compare((char *)&this->TargetNameReal);
    if (iVar3 != 0) {
      return;
    }
LAB_003ac068:
    this->TagType = CUSTOM_TARGET;
    break;
  default:
    goto switchD_003abc85_default;
  }
  GenerateTarget(this);
switchD_003abc85_default:
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::Generate()
{
  // Determine type of target for this project
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::EXECUTABLE: {
      // Get the name of the executable to generate.
      this->TargetNameReal =
        this->GeneratorTarget->GetExecutableNames(this->ConfigName).Real;
      if (this->cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()) {
        this->TagType = GhsMultiGpj::INTERGRITY_APPLICATION;
      } else {
        this->TagType = GhsMultiGpj::PROGRAM;
      }
      break;
    }
    case cmStateEnums::STATIC_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::LIBRARY;
      break;
    }
    case cmStateEnums::SHARED_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> SHARED ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      this->TargetNameReal =
        this->GeneratorTarget->GetLibraryNames(this->ConfigName).Real;
      this->TagType = GhsMultiGpj::SUBPROJECT;
      break;
    }
    case cmStateEnums::MODULE_LIBRARY: {
      std::string msg =
        cmStrCat("add_library(<name> MODULE ...) not supported: ", this->Name);
      cmSystemTools::Message(msg);
      return;
    }
    case cmStateEnums::UTILITY: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      break;
    }
    case cmStateEnums::GLOBAL_TARGET: {
      this->TargetNameReal = this->GeneratorTarget->GetName();
      if (this->TargetNameReal ==
          this->GetGlobalGenerator()->GetInstallTargetName()) {
        this->TagType = GhsMultiGpj::CUSTOM_TARGET;
      } else {
        return;
      }
      break;
    }
    default:
      return;
  }

  this->GenerateTarget();
}